

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_helpers.c
# Opt level: O0

int SetHTTPrequest(Configurable *config,HttpReq req,HttpReq *store)

{
  HttpReq *store_local;
  HttpReq req_local;
  Configurable *config_local;
  
  if ((*store == HTTPREQ_UNSPEC) || (*store == req)) {
    *store = req;
    config_local._4_4_ = 0;
  }
  else {
    warnf(config,"You can only select one HTTP request!\n");
    config_local._4_4_ = 1;
  }
  return config_local._4_4_;
}

Assistant:

int SetHTTPrequest(struct Configurable *config, HttpReq req, HttpReq *store)
{
  if((*store == HTTPREQ_UNSPEC) ||
     (*store == req)) {
    *store = req;
    return 0;
  }
  warnf(config, "You can only select one HTTP request!\n");
  return 1;
}